

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_ls.c
# Opt level: O0

int IDASetLSNormFactor(void *ida_mem,sunrealtype nrmfac)

{
  long lVar1;
  double in_XMM0_Qa;
  double dVar2;
  int retval;
  IDALsMem idals_mem;
  IDAMem IDA_mem;
  IDAMem *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  void *in_stack_ffffffffffffffc8;
  undefined8 local_28;
  undefined4 local_4;
  
  local_4 = idaLs_AccessLMem(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                             in_stack_ffffffffffffffb8,(IDALsMem *)0x11bb1a);
  if (local_4 == 0) {
    if (in_XMM0_Qa <= 0.0) {
      if (0.0 <= in_XMM0_Qa) {
        lVar1 = N_VGetLength(*(undefined8 *)(local_28 + 0x30));
        if (0.0 < (double)lVar1) {
          lVar1 = N_VGetLength(*(undefined8 *)(local_28 + 0x30));
          dVar2 = sqrt((double)lVar1);
        }
        else {
          dVar2 = 0.0;
        }
        *(double *)(local_28 + 0x70) = dVar2;
      }
      else {
        N_VConst(0x3ff0000000000000,*(undefined8 *)(local_28 + 0x30));
        dVar2 = (double)N_VDotProd(*(undefined8 *)(local_28 + 0x30),*(undefined8 *)(local_28 + 0x30)
                                  );
        if (0.0 < dVar2) {
          dVar2 = (double)N_VDotProd(*(undefined8 *)(local_28 + 0x30),
                                     *(undefined8 *)(local_28 + 0x30));
          dVar2 = sqrt(dVar2);
        }
        else {
          dVar2 = 0.0;
        }
        *(double *)(local_28 + 0x70) = dVar2;
      }
    }
    else {
      *(double *)(local_28 + 0x70) = in_XMM0_Qa;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int IDASetLSNormFactor(void* ida_mem, sunrealtype nrmfac)
{
  IDAMem IDA_mem;
  IDALsMem idals_mem;
  int retval;

  /* access IDALsMem structure */
  retval = idaLs_AccessLMem(ida_mem, __func__, &IDA_mem, &idals_mem);
  if (retval != IDALS_SUCCESS) { return (retval); }

  if (nrmfac > ZERO)
  {
    /* user-provided factor */
    idals_mem->nrmfac = nrmfac;
  }
  else if (nrmfac < ZERO)
  {
    /* compute factor for WRMS norm with dot product */
    N_VConst(ONE, idals_mem->ytemp);
    idals_mem->nrmfac = SUNRsqrt(N_VDotProd(idals_mem->ytemp, idals_mem->ytemp));
  }
  else
  {
    /* compute default factor for WRMS norm from vector legnth */
    idals_mem->nrmfac = SUNRsqrt(N_VGetLength(idals_mem->ytemp));
  }

  return (IDALS_SUCCESS);
}